

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O1

double __thiscall
HighsLinearSumBounds::getResidualSumLower
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  double dVar1;
  int iVar2;
  pointer pHVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  
  iVar2 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[sum];
  if (iVar2 == 1) {
    if (coefficient <= 0.0) {
      if (this->implVarUpperSource[var] == sum) {
        pdVar5 = this->varUpper + var;
      }
      else {
        pdVar4 = this->varUpper + var;
        dVar1 = this->implVarUpper[var];
        pdVar5 = this->implVarUpper + var;
        if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
          pdVar5 = pdVar4;
        }
      }
      if (*pdVar5 < INFINITY) {
        return -INFINITY;
      }
    }
    else {
      if (this->implVarLowerSource[var] == sum) {
        pdVar4 = this->varLower + var;
      }
      else {
        pdVar4 = this->implVarLower + var;
        dVar1 = this->varLower[var];
        if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
          pdVar4 = this->varLower + var;
        }
      }
      if (-INFINITY < *pdVar4) {
        return -INFINITY;
      }
    }
    pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    return pHVar3[sum].hi + pHVar3[sum].lo;
  }
  if (iVar2 != 0) {
    return -INFINITY;
  }
  if (coefficient <= 0.0) {
    if (this->implVarUpperSource[var] == sum) {
      pdVar4 = this->varUpper + var;
      goto LAB_0037e11f;
    }
    pdVar5 = this->varUpper + var;
    pdVar4 = this->implVarUpper + var;
    bVar7 = *pdVar4 == *pdVar5;
    bVar6 = *pdVar4 < *pdVar5;
  }
  else {
    if (this->implVarLowerSource[var] == sum) {
      pdVar4 = this->varLower + var;
      goto LAB_0037e11f;
    }
    pdVar5 = this->varLower + var;
    pdVar4 = this->implVarLower + var;
    bVar7 = *pdVar5 == *pdVar4;
    bVar6 = *pdVar5 < *pdVar4;
  }
  if (!bVar6 && !bVar7) {
    pdVar4 = pdVar5;
  }
LAB_0037e11f:
  pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pHVar3[sum].hi;
  dVar8 = dVar1 - coefficient * *pdVar4;
  return (-(coefficient * *pdVar4) - (dVar8 - dVar1)) + (dVar1 - (dVar8 - (dVar8 - dVar1))) +
         pHVar3[sum].lo + dVar8;
}

Assistant:

double HighsLinearSumBounds::getResidualSumLower(HighsInt sum, HighsInt var,
                                                 double coefficient) const {
  switch (numInfSumLower[sum]) {
    case 0:
      if (coefficient > 0) {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return double(sumLower[sum] - vLower * coefficient);
      } else {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return double(sumLower[sum] - vUpper * coefficient);
      }
      break;
    case 1:
      if (coefficient > 0) {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return vLower == -kHighsInf ? double(sumLower[sum]) : -kHighsInf;
      } else {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return vUpper == kHighsInf ? double(sumLower[sum]) : -kHighsInf;
      }
      break;
    default:
      return -kHighsInf;
  }
}